

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_> *
__thiscall
array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>::operator=
          (array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
           *this,array<CTilesetMapper::CRuleCondition,_allocator_default<CTilesetMapper::CRuleCondition>_>
                 *other)

{
  int new_len;
  CRuleCondition *pCVar1;
  CRuleCondition *pCVar2;
  long lVar3;
  long lVar4;
  
  new_len = other->num_elements;
  if (this->list_size < new_len) {
    alloc(this,new_len);
  }
  this->num_elements = new_len;
  if (0 < new_len) {
    lVar3 = 0;
    lVar4 = 0;
    do {
      pCVar1 = other->list;
      pCVar2 = this->list;
      *(undefined4 *)((long)&pCVar2->m_Value + lVar3) =
           *(undefined4 *)((long)&pCVar1->m_Value + lVar3);
      *(undefined8 *)((long)&pCVar2->m_X + lVar3) = *(undefined8 *)((long)&pCVar1->m_X + lVar3);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0xc;
    } while (lVar4 < this->num_elements);
  }
  return this;
}

Assistant:

array &operator = (const array &other)
	{
		set_size(other.size());
		for(int i = 0; i < size(); i++)
			(*this)[i] = other[i];
		return *this;
	}